

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

void __thiscall network_pimpl::insert_event(network_pimpl *this,EventDataType *value)

{
  bool bVar1;
  __type _Var2;
  EventDataType *this_00;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  EventDataType *ev;
  iterator __end1;
  iterator __begin1;
  vector<EventDataType,_std::allocator<EventDataType>_> *__range1;
  EventDataType *in_stack_fffffffffffffee8;
  __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
  *in_stack_fffffffffffffef0;
  string *psVar4;
  value_type *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  byte in_stack_ffffffffffffff06;
  byte in_stack_ffffffffffffff07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string local_c8 [39];
  byte local_a1;
  string local_a0 [48];
  string local_70 [32];
  string local_50 [32];
  reference local_30;
  EventDataType *local_28;
  __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
  local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_18 = in_RDI + 4;
  local_20._M_current =
       (EventDataType *)
       std::vector<EventDataType,_std::allocator<EventDataType>_>::begin(in_stack_fffffffffffffee8);
  local_28 = (EventDataType *)
             std::vector<EventDataType,_std::allocator<EventDataType>_>::end
                       ((vector<EventDataType,_std::allocator<EventDataType>_> *)
                        in_stack_fffffffffffffee8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffef0,
                       (__normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar1) {
      std::vector<EventDataType,_std::allocator<EventDataType>_>::push_back
                ((vector<EventDataType,_std::allocator<EventDataType>_> *)
                 CONCAT17(in_stack_ffffffffffffff07,
                          CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
                 in_stack_fffffffffffffef8);
      return;
    }
    local_30 = __gnu_cxx::
               __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
               ::operator*(&local_20);
    EventDataType::getName_abi_cxx11_(in_stack_fffffffffffffee8);
    local_a1 = 0;
    EventDataType::getName_abi_cxx11_(in_stack_fffffffffffffee8);
    _Var2 = std::operator==(in_stack_ffffffffffffff10,in_RDI);
    in_stack_ffffffffffffff06 = 0;
    in_stack_ffffffffffffff07 = in_stack_ffffffffffffff06;
    if (_Var2) {
      EventDataType::getOrigin_abi_cxx11_(in_stack_fffffffffffffee8);
      local_a1 = 1;
      EventDataType::getOrigin_abi_cxx11_(in_stack_fffffffffffffee8);
      in_stack_ffffffffffffff06 = std::operator==(in_stack_ffffffffffffff10,in_RDI);
      in_stack_ffffffffffffff07 = in_stack_ffffffffffffff06;
      std::__cxx11::string::~string(local_c8);
    }
    if ((local_a1 & 1) != 0) {
      std::__cxx11::string::~string(local_a0);
    }
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    if ((in_stack_ffffffffffffff06 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<EventDataType_*,_std::vector<EventDataType,_std::allocator<EventDataType>_>_>
    ::operator++(&local_20);
  }
  this_00 = (EventDataType *)std::operator<<((ostream *)&std::cerr,"---duplicate event ");
  psVar4 = (string *)&stack0xffffffffffffff10;
  EventDataType::getName_abi_cxx11_(this_00);
  poVar3 = std::operator<<((ostream *)this_00,psVar4);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  return;
}

Assistant:

void network_pimpl::insert_event(const EventDataType &value){
    for(auto const& ev : events){
        if(ev.getName() == value.getName() && ev.getOrigin() == value.getOrigin()){
            std::cerr << "---duplicate event " << ev.getName() << "\n";
            return;
        }
    }
    events.push_back(value);
}